

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryMaterialProperty
          (AssbinImporter *this,IOStream *stream,aiMaterialProperty *prop)

{
  uint uVar1;
  aiPropertyTypeInfo aVar2;
  char *pcVar3;
  runtime_error *this_00;
  aiString local_428;
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x123e) {
    Read<unsigned_int>(stream);
    Read<aiString>(&local_428,stream);
    if ((aiMaterialProperty *)&local_428 != prop) {
      (prop->mKey).length = local_428.length;
      memcpy((prop->mKey).data,(void *)((long)&local_428 + 4),local_428._0_8_ & 0xffffffff);
      (prop->mKey).data[local_428._0_8_ & 0xffffffff] = '\0';
    }
    uVar1 = Read<unsigned_int>(stream);
    prop->mSemantic = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    prop->mIndex = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    prop->mDataLength = uVar1;
    aVar2 = Read<unsigned_int>(stream);
    prop->mType = aVar2;
    uVar1 = prop->mDataLength;
    pcVar3 = (char *)operator_new__((ulong)uVar1);
    prop->mData = pcVar3;
    (*stream->_vptr_IOStream[2])(stream,pcVar3,1,(ulong)uVar1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_428._0_8_ = local_428.data + 0xc;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_428,"Magic chunk identifiers are wrong!","");
  std::runtime_error::runtime_error(this_00,(string *)&local_428);
  *(undefined ***)this_00 = &PTR__runtime_error_007dd738;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryMaterialProperty(IOStream * stream, aiMaterialProperty* prop) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMATERIALPROPERTY)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    prop->mKey = Read<aiString>(stream);
    prop->mSemantic = Read<unsigned int>(stream);
    prop->mIndex = Read<unsigned int>(stream);

    prop->mDataLength = Read<unsigned int>(stream);
    prop->mType = (aiPropertyTypeInfo)Read<unsigned int>(stream);
    prop->mData = new char [ prop->mDataLength ];
    stream->Read(prop->mData,1,prop->mDataLength);
}